

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_common.cpp
# Opt level: O0

void __thiscall cfd::SignParameter::SignParameter(SignParameter *this,ByteData *data)

{
  ByteData *in_RDI;
  ByteData *pBVar1;
  
  pBVar1 = in_RDI;
  core::ByteData::ByteData(in_RDI,in_RDI);
  *(undefined4 *)
   &pBVar1[1].data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = 1;
  cfd::core::Pubkey::Pubkey
            ((Pubkey *)
             &pBVar1[1].data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  *(undefined1 *)
   &in_RDI[2].data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = 0;
  cfd::core::SigHashType::SigHashType
            ((SigHashType *)
             ((long)&in_RDI[2].data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish + 4));
  cfd::core::ScriptOperator::ScriptOperator
            ((ScriptOperator *)(in_RDI + 3),
             (ScriptOperator *)&core::ScriptOperator::OP_INVALIDOPCODE);
  return;
}

Assistant:

SignParameter::SignParameter(const ByteData& data)
    : data_(data),
      data_type_(SignDataType::kBinary),
      related_pubkey_(),
      der_encode_(false),
      sighash_type_(),
      op_code_(ScriptOperator::OP_INVALIDOPCODE) {
  // do nothing
}